

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall Kvm::printCell(Kvm *this,Value *v,ostream *out)

{
  bool bVar1;
  Value *pVVar2;
  ostream *out_local;
  Value *v_local;
  Kvm *this_local;
  
  pVVar2 = car(v);
  print(this,pVVar2,out);
  pVVar2 = cdr(v);
  bVar1 = isCell(pVVar2);
  if (bVar1) {
    std::operator<<(out," ");
    pVVar2 = cdr(v);
    printCell(this,pVVar2,out);
  }
  else {
    pVVar2 = cdr(v);
    if (pVVar2 != this->NIL) {
      std::operator<<(out," . ");
      pVVar2 = cdr(v);
      print(this,pVVar2,out);
    }
  }
  return;
}

Assistant:

void Kvm::printCell(const Value *v, std::ostream &out)
{
    print(car(v), out);
    if (isCell(cdr(v)))
    {
        out << " ";
        printCell(cdr(v), out);
    } else if (cdr(v) != NIL)
    {
        out << " . ";
        print(cdr(v), out);
    }
}